

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow.c
# Opt level: O2

void upscale_flow_component(double *flow,int cur_width,int cur_height,int stride,double *tmpbuf)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  double *pdVar7;
  ulong uVar8;
  double *pdVar9;
  ulong uVar10;
  double *pdVar11;
  int iVar12;
  double *pdVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  bool bVar18;
  double dVar19;
  
  uVar2 = 0;
  uVar8 = 0;
  if (0 < cur_width) {
    uVar8 = (ulong)(uint)cur_width;
  }
  lVar4 = (long)stride;
  uVar10 = 0;
  if (0 < cur_height) {
    uVar10 = (ulong)(uint)cur_height;
  }
  iVar15 = -2;
  iVar3 = -1;
  for (; uVar2 != uVar10; uVar2 = uVar2 + 1) {
    iVar14 = iVar15;
    iVar12 = iVar3;
    for (uVar16 = 0; uVar16 != uVar8; uVar16 = uVar16 + 1) {
      dVar19 = 0.0;
      iVar17 = iVar14;
      for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 8) {
        dVar19 = dVar19 + flow[iVar17] * *(double *)((long)flow_upscale_filter[0] + lVar6);
        iVar17 = iVar17 + 1;
      }
      tmpbuf[uVar2 * lVar4 + uVar16 * 2] = dVar19 + dVar19;
      dVar19 = 0.0;
      for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
        dVar19 = dVar19 + flow[iVar12 + (int)lVar6] * flow_upscale_filter[1][lVar6];
      }
      tmpbuf[(int)uVar16 * 2 + (int)(uVar2 * lVar4) + 1] = dVar19 + dVar19;
      iVar14 = iVar14 + 1;
      iVar12 = iVar12 + 1;
    }
    iVar15 = iVar15 + stride;
    iVar3 = iVar3 + stride;
  }
  uVar1 = cur_width * 2;
  pdVar5 = tmpbuf + lVar4 * -2;
  lVar6 = 2;
  while (bVar18 = lVar6 != 0, lVar6 = lVar6 + -1, bVar18) {
    memcpy(pdVar5,tmpbuf,(long)(int)uVar1 << 3);
    pdVar5 = pdVar5 + lVar4;
  }
  lVar6 = (long)cur_height;
  pdVar5 = tmpbuf + lVar4 * lVar6;
  for (; lVar6 < cur_height + 2; lVar6 = lVar6 + 1) {
    memcpy(pdVar5,tmpbuf + (cur_height + -1) * stride,(long)(int)uVar1 << 3);
    pdVar5 = pdVar5 + lVar4;
  }
  uVar8 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar8;
  }
  pdVar5 = tmpbuf + lVar4 * -2;
  pdVar7 = tmpbuf + -lVar4;
  for (; uVar8 != uVar10; uVar8 = uVar8 + 1) {
    pdVar9 = pdVar7;
    pdVar11 = pdVar5;
    for (uVar16 = 0; uVar16 != uVar2; uVar16 = uVar16 + 1) {
      dVar19 = 0.0;
      pdVar13 = pdVar11;
      for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 8) {
        dVar19 = dVar19 + *pdVar13 * *(double *)((long)flow_upscale_filter[0] + lVar6);
        pdVar13 = pdVar13 + lVar4;
      }
      flow[uVar8 * 2 * lVar4 + uVar16] = dVar19;
      dVar19 = 0.0;
      pdVar13 = pdVar9;
      for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
        dVar19 = dVar19 + *pdVar13 * flow_upscale_filter[1][lVar6];
        pdVar13 = pdVar13 + lVar4;
      }
      flow[(uVar8 * 2 + 1) * lVar4 + uVar16] = dVar19;
      pdVar11 = pdVar11 + 1;
      pdVar9 = pdVar9 + 1;
    }
    pdVar5 = pdVar5 + lVar4;
    pdVar7 = pdVar7 + lVar4;
  }
  return;
}

Assistant:

static void upscale_flow_component(double *flow, int cur_width, int cur_height,
                                   int stride, double *tmpbuf) {
  const int half_len = FLOW_UPSCALE_TAPS / 2;

  // Check that the outer border is large enough to avoid needing to clamp
  // the source locations
  assert(half_len <= FLOW_BORDER_OUTER);

  // Horizontal upscale and multiply by 2
  for (int i = 0; i < cur_height; i++) {
    for (int j = 0; j < cur_width; j++) {
      double left = 0;
      for (int k = -half_len; k < half_len; k++) {
        left +=
            flow[i * stride + (j + k)] * flow_upscale_filter[0][k + half_len];
      }
      tmpbuf[i * stride + (2 * j + 0)] = 2.0 * left;

      // Right output pixel is 0.25 units to the right of the input pixel
      double right = 0;
      for (int k = -(half_len - 1); k < (half_len + 1); k++) {
        right += flow[i * stride + (j + k)] *
                 flow_upscale_filter[1][k + (half_len - 1)];
      }
      tmpbuf[i * stride + (2 * j + 1)] = 2.0 * right;
    }
  }

  // Fill in top and bottom borders of tmpbuf
  const double *top_row = &tmpbuf[0];
  for (int i = -FLOW_BORDER_OUTER; i < 0; i++) {
    double *row = &tmpbuf[i * stride];
    memcpy(row, top_row, 2 * cur_width * sizeof(*row));
  }

  const double *bottom_row = &tmpbuf[(cur_height - 1) * stride];
  for (int i = cur_height; i < cur_height + FLOW_BORDER_OUTER; i++) {
    double *row = &tmpbuf[i * stride];
    memcpy(row, bottom_row, 2 * cur_width * sizeof(*row));
  }

  // Vertical upscale
  int upscaled_width = cur_width * 2;
  for (int i = 0; i < cur_height; i++) {
    for (int j = 0; j < upscaled_width; j++) {
      double top = 0;
      for (int k = -half_len; k < half_len; k++) {
        top +=
            tmpbuf[(i + k) * stride + j] * flow_upscale_filter[0][k + half_len];
      }
      flow[(2 * i) * stride + j] = top;

      double bottom = 0;
      for (int k = -(half_len - 1); k < (half_len + 1); k++) {
        bottom += tmpbuf[(i + k) * stride + j] *
                  flow_upscale_filter[1][k + (half_len - 1)];
      }
      flow[(2 * i + 1) * stride + j] = bottom;
    }
  }
}